

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::Utils::getShaderStageString_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,_shader_stage *shader_stage)

{
  TestError *this_00;
  allocator<char> local_1a;
  undefined1 local_19;
  Utils *local_18;
  _shader_stage *shader_stage_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  shader_stage_local = (_shader_stage *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_1a)
  ;
  std::allocator<char>::~allocator(&local_1a);
  switch(*(undefined4 *)local_18) {
  case 0:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Vertex Shader");
    break;
  case 1:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Tessellation Control Shader");
    break;
  case 2:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"Tessellation Evaluation Shader");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Geometry Shader");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Fragment Shader");
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader stage",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x4ea);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getShaderStageString(const _shader_stage& shader_stage)
{
	std::string result = "?";

	switch (shader_stage)
	{
	case SHADER_STAGE_FRAGMENT:
		result = "Fragment Shader";
		break;
	case SHADER_STAGE_GEOMETRY:
		result = "Geometry Shader";
		break;
	case SHADER_STAGE_TESSELLATION_CONTROL:
		result = "Tessellation Control Shader";
		break;
	case SHADER_STAGE_TESSELLATION_EVALUATION:
		result = "Tessellation Evaluation Shader";
		break;
	case SHADER_STAGE_VERTEX:
		result = "Vertex Shader";
		break;

	default:
	{
		TCU_FAIL("Unrecognized shader stage");
	}
	} /* switch (shader_stage) */

	return result;
}